

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::truncate
          (ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this,char *__file,__off_t __length
          )

{
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar1;
  ClientHook *pCVar2;
  Disposer *pDVar3;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar4;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar5;
  
  pMVar1 = this->ptr;
  pMVar5 = this->pos;
  while (pMVar4 = pMVar5, pMVar1 + (long)__file < pMVar4) {
    this->pos = pMVar4 + -1;
    pCVar2 = pMVar4[-1].ptr.ptr;
    pMVar5 = pMVar4 + -1;
    if (pCVar2 != (ClientHook *)0x0) {
      pMVar4[-1].ptr.ptr = (ClientHook *)0x0;
      pDVar3 = pMVar4[-1].ptr.disposer;
      (**pDVar3->_vptr_Disposer)
                (pDVar3,pCVar2->_vptr_ClientHook[-2] + (long)&pCVar2->_vptr_ClientHook);
      pMVar5 = this->pos;
    }
  }
  return (int)pMVar4;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }